

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  re2 *this_00;
  const_pointer pcVar1;
  RegexpStatus *pRVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  ParseFlags PVar7;
  char *pcVar8;
  StringPiece t;
  Rune c;
  StringPiece local_1c8;
  undefined1 local_1b0 [384];
  
  local_1c8.data_ = s->data_;
  local_1c8.size_ = s->size_;
  PVar7 = this->flags_;
  if (((((PVar7 >> 9 & 1) == 0) || (local_1c8.size_ < 2)) || (*local_1c8.data_ != '(')) ||
     (local_1c8.data_[1] != '?')) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
               ,0x7fb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Bad call to ParseState::ParsePerlFlags",0x26);
    LogMessage::~LogMessage((LogMessage *)local_1b0);
    this->status_->code_ = kRegexpInternalError;
  }
  else {
    pcVar8 = local_1c8.data_ + 2;
    local_1c8.size_ = local_1c8.size_ - 2;
    if (((local_1c8.size_ < 3) || (*pcVar8 != 'P')) || (local_1c8.data_[3] != '<')) {
      local_1c8.data_ = pcVar8;
      if (local_1c8.size_ != 0) {
        bVar4 = false;
        bVar3 = 0;
        do {
          iVar5 = StringPieceToRune((Rune *)local_1b0,&local_1c8,this->status_);
          if (iVar5 < 0) {
            return false;
          }
          if ((int)local_1b0._0_4_ < 0x69) {
            if (0x39 < (int)local_1b0._0_4_) {
              if (local_1b0._0_4_ == 0x55) {
                if (bVar4) {
                  PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                   PerlClasses|Latin1|OneLine|MatchNL|Literal|FoldCase);
                }
                else {
                  PVar7 = PVar7 | NonGreedy;
                }
                goto LAB_001c09c6;
              }
              if (local_1b0._0_4_ == 0x3a) {
                DoLeftParenNoCapture(this);
                goto LAB_001c0a0a;
              }
              break;
            }
            if (local_1b0._0_4_ != 0x2d) {
              if (local_1b0._0_4_ == 0x29) {
LAB_001c0a0a:
                if ((bool)(bVar3 | ~bVar4)) {
                  this->flags_ = PVar7;
                  s->data_ = local_1c8.data_;
                  s->size_ = local_1c8.size_;
                  return true;
                }
              }
              break;
            }
            if (bVar4) break;
            bVar4 = true;
            bVar3 = 0;
          }
          else {
            if (local_1b0._0_4_ == 0x73) {
              if (bVar4) {
                PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                 PerlClasses|NonGreedy|Latin1|OneLine|ClassNL|Literal|FoldCase);
              }
              else {
                PVar7 = PVar7 | DotNL;
              }
            }
            else if (local_1b0._0_4_ == 0x6d) {
              if (bVar4) {
                PVar7 = PVar7 | OneLine;
              }
              else {
                PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                 PerlClasses|NonGreedy|Latin1|MatchNL|Literal|FoldCase);
              }
            }
            else {
              if (local_1b0._0_4_ != 0x69) break;
              if (bVar4) {
                PVar7 = PVar7 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|
                                 PerlClasses|NonGreedy|Latin1|OneLine|MatchNL|Literal);
              }
              else {
                PVar7 = PVar7 | FoldCase;
              }
            }
LAB_001c09c6:
            bVar3 = 1;
          }
        } while (local_1c8.size_ != 0);
      }
      pRVar2 = this->status_;
      pRVar2->code_ = kRegexpBadPerlOp;
      pcVar1 = s->data_;
      (pRVar2->error_arg_).data_ = pcVar1;
      (pRVar2->error_arg_).size_ = (long)local_1c8.data_ - (long)pcVar1;
    }
    else {
      local_1c8.data_ = pcVar8;
      sVar6 = StringPiece::find(&local_1c8,'>',2);
      pcVar1 = local_1c8.data_;
      if (sVar6 == 0xffffffffffffffff) {
        bVar4 = IsValidUTF8(s,this->status_);
        if (bVar4) {
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          sVar6 = s->size_;
          (pRVar2->error_arg_).data_ = s->data_;
          (pRVar2->error_arg_).size_ = sVar6;
        }
      }
      else {
        this_00 = (re2 *)(local_1c8.data_ + 2);
        local_1b0._0_8_ = this_00;
        local_1b0._8_8_ = (StringPiece *)(sVar6 - 2);
        bVar4 = IsValidUTF8((StringPiece *)local_1b0,this->status_);
        if (bVar4) {
          pcVar8 = pcVar1 + -2;
          bVar4 = IsValidCaptureName(this_00,(StringPiece *)(sVar6 - 2));
          if (bVar4) {
            DoLeftParen(this,(StringPiece *)local_1b0);
            pcVar1 = s->data_;
            s->data_ = pcVar8 + sVar6 + 3;
            s->size_ = (size_type)(pcVar1 + (s->size_ - (long)(pcVar8 + sVar6 + 3)));
            return true;
          }
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).data_ = pcVar8;
          (pRVar2->error_arg_).size_ = sVar6 + 3;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.data()-2, end+3);  // "(?P<name>"
    StringPiece name(t.data()+2, end-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(
        static_cast<size_t>(capture.data() + capture.size() - s->data()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->data(), static_cast<size_t>(t.data() - s->data())));
  return false;
}